

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::sendCommand
          (CommonCore *this,string_view target,string_view commandStr,string_view source,
          HelicsSequencingModes mode)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view federateName;
  bool bVar1;
  GlobalBrokerId id;
  FederateState *pFVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  CommonCore *in_RDI;
  __sv_type _Var3;
  FederateState *fed;
  ActionMessage cmdcmd;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  BrokerBase *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe20;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  undefined4 in_stack_fffffffffffffe38;
  GlobalFederateId in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe40;
  CommonCore *in_stack_fffffffffffffe70;
  size_t sVar4;
  char *pcVar5;
  GlobalFederateId local_14c [3];
  BaseType local_140;
  BaseType local_138;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 local_70 [96];
  undefined8 local_10;
  undefined8 uStack_8;
  
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffe20,
             (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  __x._M_len._4_4_ = in_stack_fffffffffffffe3c.gid;
  __x._M_len._0_4_ = in_stack_fffffffffffffe38;
  __x._M_str = in_stack_fffffffffffffe40;
  __y._M_str = (char *)in_RDI;
  __y._M_len = (size_t)this_00;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    local_80 = local_10;
    local_78 = uStack_8;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe20,
               (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    (*(in_RDI->super_Core)._vptr_Core[0x5e])(local_70,in_RDI,local_80,local_78,local_90,local_88,1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe10);
  }
  else {
    ActionMessage::ActionMessage((ActionMessage *)in_RDI,(action_t)((ulong)this_00 >> 0x20));
    GlobalFederateId::GlobalFederateId(local_14c,(GlobalBrokerId)0x0);
    local_138 = local_14c[0].gid;
    SmallBuffer::operator=
              ((SmallBuffer *)CONCAT44(in_stack_fffffffffffffe3c.gid,in_stack_fffffffffffffe38),
               (basic_string_view<char,_std::char_traits<char>_> *)in_RDI);
    str._M_len._4_4_ = in_stack_fffffffffffffe3c.gid;
    str._M_len._0_4_ = in_stack_fffffffffffffe38;
    str._M_str = in_stack_fffffffffffffe40;
    ActionMessage::setString((ActionMessage *)in_RDI,(int)((ulong)this_00 >> 0x20),str);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(this_00);
    if (bVar1) {
      getIdentifier_abi_cxx11_(in_RDI);
      _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffe10);
      str_01._M_len._4_4_ = in_stack_fffffffffffffe3c.gid;
      str_01._M_len._0_4_ = in_stack_fffffffffffffe38;
      str_01._M_str = (char *)_Var3._M_len;
      ActionMessage::setString((ActionMessage *)in_RDI,(int)((ulong)this_00 >> 0x20),str_01);
      id = BrokerBase::getGlobalId
                     ((BrokerBase *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffe3c,id);
      local_140 = in_stack_fffffffffffffe3c.gid;
    }
    else {
      sVar4 = this_00->_M_len;
      pcVar5 = this_00->_M_str;
      str_00._M_len._4_4_ = in_stack_fffffffffffffe3c.gid;
      str_00._M_len._0_4_ = in_stack_fffffffffffffe38;
      str_00._M_str = in_stack_fffffffffffffe40;
      ActionMessage::setString((ActionMessage *)in_RDI,(int)((ulong)this_00 >> 0x20),str_00);
      federateName._M_str = pcVar5;
      federateName._M_len = sVar4;
      pFVar2 = getFederate(in_stack_fffffffffffffe70,federateName);
      if (pFVar2 != (FederateState *)0x0) {
        local_140 = (BaseType)
                    std::atomic::operator_cast_to_GlobalFederateId
                              ((atomic<helics::GlobalFederateId> *)
                               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      }
    }
    BrokerBase::addActionMessage
              (in_stack_fffffffffffffe10,
               (ActionMessage *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe10);
  }
  return;
}

Assistant:

void CommonCore::sendCommand(std::string_view target,
                             std::string_view commandStr,
                             std::string_view source,
                             HelicsSequencingModes mode)
{
    if (commandStr == "flush") {
        query(target, "global_flush", HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED);
        return;
    }
    ActionMessage cmdcmd(mode == HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED ?
                             CMD_SEND_COMMAND_ORDERED :
                             CMD_SEND_COMMAND);
    cmdcmd.dest_id = parent_broker_id;
    cmdcmd.payload = commandStr;
    cmdcmd.setString(targetStringLoc, target);
    if (!source.empty()) {
        cmdcmd.setString(sourceStringLoc, source);
        const auto* fed = getFederate(source);
        if (fed != nullptr) {
            cmdcmd.source_id = fed->global_id;
        }
    } else {
        cmdcmd.setString(sourceStringLoc, getIdentifier());
        cmdcmd.source_id = getGlobalId();
    }
    addActionMessage(std::move(cmdcmd));
}